

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.h
# Opt level: O2

void __thiscall
jsonnet::internal::TraceFrame::TraceFrame(TraceFrame *this,LocationRange *location,string *name)

{
  LocationRange::LocationRange(&this->location,location);
  std::__cxx11::string::string((string *)&this->name,(string *)name);
  return;
}

Assistant:

TraceFrame(const LocationRange &location, const std::string &name = "")
        : location(location), name(name)
    {
    }